

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O2

void rsg::anon_unknown_27::fillUndefinedShaderInputs
               (vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs)

{
  Type TVar1;
  ShaderInput *pSVar2;
  Variable *this;
  ConstValueRangeAccess valueRange;
  bool bVar3;
  VariableType *pVVar4;
  TestError *this_00;
  int elemNdx;
  long lVar5;
  Scalar *pSVar6;
  pointer pSVar7;
  pointer ppSVar8;
  
  ppSVar8 = (inputs->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppSVar8 ==
        (inputs->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pSVar2 = *ppSVar8;
    this = pSVar2->m_variable;
    TVar1 = (this->m_type).m_baseType;
    if ((TVar1 & ~TYPE_FLOAT) != TYPE_SAMPLER_2D) {
      if (2 < TVar1 - TYPE_FLOAT) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT || baseType == VariableType::TYPE_BOOL"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgShaderGenerator.cpp"
                   ,0x8e);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pSVar7 = (pSVar2->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      pSVar6 = (pSVar2->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      for (lVar5 = 0; lVar5 < (this->m_type).m_numElements; lVar5 = lVar5 + 1) {
        pVVar4 = VariableType::getElementType(&this->m_type);
        valueRange.m_min = pSVar7;
        valueRange.m_type = pVVar4;
        valueRange.m_max = pSVar6;
        bVar3 = isUndefinedValueRange(valueRange);
        if (bVar3) {
          VariableType::getElementType(&this->m_type);
          VariableType::getElementType(&this->m_type);
          if (TVar1 == TYPE_BOOL) {
            pSVar7->boolVal = false;
            pSVar6->boolVal = true;
          }
          else if (TVar1 == TYPE_INT) {
            pSVar7->intVal = 0;
            pSVar6->intVal = 1;
          }
          else if (TVar1 == TYPE_FLOAT) {
            pSVar7->intVal = 0;
            pSVar6->intVal = 0x3f800000;
          }
        }
        pSVar6 = pSVar6 + 1;
        pSVar7 = pSVar7 + 1;
      }
    }
    ppSVar8 = ppSVar8 + 1;
  } while( true );
}

Assistant:

void fillUndefinedShaderInputs (vector<ShaderInput*>& inputs)
{
	for (vector<ShaderInput*>::iterator i = inputs.begin(); i != inputs.end(); i++)
	{
		if (!(*i)->getVariable()->getType().isSampler()) // Samplers are assigned at program-level.
			fillUndefinedComponents((*i)->getValueRange());
	}
}